

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * cmsys::SystemTools::AddSpaceBetweenCapitalizedWords
                   (string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (s->_M_string_length != 0) {
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    cVar4 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar4);
    if (1 < s->_M_string_length) {
      uVar5 = 1;
      do {
        pcVar1 = (s->_M_dataplus)._M_p;
        iVar2 = isupper((int)pcVar1[uVar5]);
        if (iVar2 != 0) {
          iVar3 = (int)pcVar1[uVar5 - 1];
          iVar2 = isspace(iVar3);
          if (iVar2 == 0) {
            iVar2 = isupper(iVar3);
            if (iVar2 == 0) {
              std::__cxx11::string::push_back(cVar4);
            }
          }
        }
        std::__cxx11::string::push_back(cVar4);
        uVar5 = uVar5 + 1;
      } while (uVar5 < s->_M_string_length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::AddSpaceBetweenCapitalizedWords(
  const kwsys_stl::string& s)
{
  kwsys_stl::string n;
  if (!s.empty())
    {
    n.reserve(s.size());
    n += s[0];
    for (size_t i = 1; i < s.size(); i++)
      {
      if (isupper(s[i]) && !isspace(s[i - 1]) && !isupper(s[i - 1]))
        {
        n += ' ';
        }
      n += s[i];
      }
    }
  return n;
}